

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdStArrGeneric<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  byte bVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  long lVar8;
  uint8 in_R8B;
  AsmJsSIMDValue AVar9;
  SIMDValue simdValue;
  ArrayBufferBase *local_70;
  SIMDValue *local_50;
  AsmJsSIMDValue value;
  AsmJsSIMDValue *data;
  RegSlot srcReg;
  uint8 dataWidth;
  BYTE *buffer;
  ArrayBufferBase *arr;
  uint64 index;
  OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x205e,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar5 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
  if (iVar5 < 0) {
    JavascriptError::ThrowRangeError
              (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"Simd typed array access");
  }
  iVar5 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
  lVar8 = (long)iVar5 + (ulong)playout->Offset;
  bVar4 = ParseableFunctionInfo::IsWasmFunction(*(ParseableFunctionInfo **)(this + 0x88));
  if (bVar4) {
    local_70 = WebAssemblyMemory::GetBuffer(*(WebAssemblyMemory **)(this + 0x138));
  }
  else {
    local_70 = (ArrayBufferBase *)GetAsmJsBuffer(this);
  }
  iVar5 = (*(local_70->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  bVar1 = playout->DataWidth;
  uVar2 = playout->Value;
  uVar6 = (*(local_70->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar6 < lVar8 + (ulong)bVar1) {
    JavascriptError::ThrowRangeError
              (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"Simd typed array access");
  }
  AVar9 = GetRegRawSimd<unsigned_int>(this,(uint)uVar2);
  local_50 = AVar9.field_0._0_8_;
  value.field_0.i64[0] = AVar9.field_0._8_8_;
  simdValue.field_0.u8[8] = bVar1;
  simdValue.field_0.f64[0] = (Type)value.field_0.i64[0];
  simdValue.field_0.i64[1]._1_7_ = 0;
  SIMDUtils::SIMDStData
            ((SIMDUtils *)(CONCAT44(extraout_var,iVar5) + lVar8),local_50,simdValue,in_R8B);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdStArrGeneric(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);

        if (GetRegRawInt(playout->SlotIndex) < 0)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        const uint64 index = (uint64)GetRegRawInt(playout->SlotIndex) + playout->Offset;

        ArrayBufferBase* arr =
#ifdef ENABLE_WASM_SIMD
        (m_functionBody->IsWasmFunction()) ?
            m_wasmMemory->GetBuffer() :
#endif
            GetAsmJsBuffer();

        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot srcReg = playout->Value;

        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value = GetRegRawSimd(srcReg);
        SIMDUtils::SIMDStData(data, value, dataWidth);
    }